

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int pcut_main(pcut_item_t *last,int argc,char **argv)

{
  pcut_item_t *ppVar1;
  int iVar2;
  int iVar3;
  pcut_item_t *item;
  pcut_item_t *ppVar4;
  pcut_item_t *ppVar5;
  char *__s;
  pcut_main_extra_t *ppVar6;
  _func_void **pp_Var7;
  pcut_main_extra_t *ppVar8;
  long lVar9;
  int run_only_test;
  int run_only_suite;
  pcut_item_t *tmp;
  char **local_58;
  uint local_4c;
  uint local_48;
  int local_44;
  pcut_item_t *local_40;
  pcut_item_t *local_38;
  
  local_58 = argv;
  local_44 = argc;
  local_40 = pcut_fix_list_get_real_head(last);
  local_48 = 0xffffffff;
  local_4c = 0xffffffff;
  ppVar6 = empty_main_extra;
  if (last->main_extras != (pcut_main_extra_t *)0x0) {
    ppVar6 = last->main_extras;
  }
  pcut_report_register_handler(&pcut_report_tap);
  ppVar8 = ppVar6;
  do {
    iVar2 = ppVar8->type;
    if (iVar2 == 2) {
      pcut_report_register_handler(&pcut_report_xml);
      iVar2 = ppVar8->type;
    }
    else if (iVar2 == 3) break;
    if (iVar2 == 0) {
      (*ppVar8->preinit_hook)(&local_44,&local_58);
    }
    ppVar8 = ppVar8 + 1;
  } while( true );
  if (1 < local_44) {
    lVar9 = 1;
    do {
      pcut_is_arg_with_number(local_58[lVar9],"-s",(int *)&local_48);
      pcut_is_arg_with_number(local_58[lVar9],"-t",(int *)&local_4c);
      iVar2 = pcut_str_equals(local_58[lVar9],"-l");
      if (iVar2 != 0) {
        pcut_print_tests(local_40);
        return 0;
      }
      iVar2 = pcut_str_equals(local_58[lVar9],"-x");
      if (iVar2 != 0) {
        pcut_report_register_handler(&pcut_report_xml);
      }
      iVar2 = pcut_str_equals(local_58[lVar9],"-u");
      if (iVar2 != 0) {
        pcut_run_mode = 2;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < local_44);
  }
  setvbuf(_stdout,(char *)0x0,2,0);
  ppVar4 = local_40;
  if (local_40 != (pcut_item_t *)0x0) {
    ppVar5 = (pcut_item_t *)0x0;
    item = local_40;
    do {
      iVar2 = item->kind;
      ppVar1 = item;
      if (iVar2 != 4) {
        ppVar1 = ppVar5;
        if (iVar2 == 3) {
          if (ppVar5 != (pcut_item_t *)0x0) {
            ppVar5->teardown_func = item->teardown_func;
          }
        }
        else {
          if (iVar2 != 2) goto LAB_001027ec;
          if (ppVar5 != (pcut_item_t *)0x0) {
            ppVar5->setup_func = item->setup_func;
          }
        }
        item->kind = 0;
      }
LAB_001027ec:
      ppVar5 = ppVar1;
      item = pcut_get_real_next(item);
    } while (item != (pcut_item_t *)0x0);
  }
  pp_Var7 = &ppVar6->init_hook;
  do {
    if (((pcut_main_extra_t *)(pp_Var7 + -1))->type == 1) {
      (**pp_Var7)();
    }
    else if (((pcut_main_extra_t *)(pp_Var7 + -1))->type == 3) {
      if ((int)(local_48 | local_4c) < 0) {
        if ((int)local_48 < 1) {
          if ((int)local_4c < 1) {
            pcut_report_init(ppVar4);
            iVar2 = 0;
            if (ppVar4 != (pcut_item_t *)0x0) {
              do {
                if (ppVar4->kind == 4) {
                  iVar3 = run_suite(ppVar4,&local_38,*local_58);
                  ppVar4 = local_38;
                  if (iVar3 != 0) {
                    iVar2 = iVar3;
                  }
                }
                else {
                  ppVar4 = pcut_get_real_next(ppVar4);
                }
              } while (ppVar4 != (pcut_item_t *)0x0);
            }
            pcut_report_done();
            return iVar2;
          }
          ppVar4 = pcut_find_by_id(ppVar4,local_4c);
          if (ppVar4 == (pcut_item_t *)0x0) {
            __s = "Test not found, aborting!";
          }
          else {
            if (ppVar4->kind == 5) {
              if (pcut_run_mode == 2) {
                iVar2 = pcut_run_test_single(ppVar4);
                return iVar2;
              }
              iVar2 = pcut_run_test_forked(ppVar4);
              return iVar2;
            }
            __s = "Invalid test id!";
          }
        }
        else {
          ppVar4 = pcut_find_by_id(ppVar4,local_48);
          if (ppVar4 == (pcut_item_t *)0x0) {
            __s = "Suite not found, aborting!";
          }
          else {
            if (ppVar4->kind == 4) {
              run_suite(ppVar4,(pcut_item_t **)0x0,*local_58);
              return 0;
            }
            __s = "Invalid suite id!";
          }
        }
      }
      else {
        __s = "Specify either -s or -t!";
      }
      puts(__s);
      return 3;
    }
    pp_Var7 = pp_Var7 + 3;
  } while( true );
}

Assistant:

int pcut_main(pcut_item_t *last, int argc, char *argv[]) {
	pcut_item_t *items = pcut_fix_list_get_real_head(last);
	pcut_item_t *it;
	pcut_main_extra_t *main_extras = last->main_extras;
	pcut_main_extra_t *main_extras_it;

	int run_only_suite = -1;
	int run_only_test = -1;

	int rc, rc_tmp;

	if (main_extras == NULL) {
		main_extras = empty_main_extra;
	}

	pcut_report_register_handler(&pcut_report_tap);

	FOR_EACH_MAIN_EXTRA(main_extras, main_extras_it) {
		if (main_extras_it->type == PCUT_MAIN_EXTRA_REPORT_XML) {
			pcut_report_register_handler(&pcut_report_xml);
		}
		if (main_extras_it->type == PCUT_MAIN_EXTRA_PREINIT_HOOK) {
			main_extras_it->preinit_hook(&argc, &argv);
		}
	}

	if (argc > 1) {
		int i;
		for (i = 1; i < argc; i++) {
			pcut_is_arg_with_number(argv[i], "-s", &run_only_suite);
			pcut_is_arg_with_number(argv[i], "-t", &run_only_test);
			if (pcut_str_equals(argv[i], "-l")) {
				pcut_print_tests(items);
				return PCUT_OUTCOME_PASS;
			}
			if (pcut_str_equals(argv[i], "-x")) {
				pcut_report_register_handler(&pcut_report_xml);
			}
#ifndef PCUT_NO_LONG_JUMP
			if (pcut_str_equals(argv[i], "-u")) {
				pcut_run_mode = PCUT_RUN_MODE_SINGLE;
			}
#endif
		}
	}

	setvbuf(stdout, NULL, _IONBF, 0);
	set_setup_teardown_callbacks(items);

	FOR_EACH_MAIN_EXTRA(main_extras, main_extras_it) {
		if (main_extras_it->type == PCUT_MAIN_EXTRA_INIT_HOOK) {
			main_extras_it->init_hook();
		}
	}

	PCUT_DEBUG("run_only_suite = %d   run_only_test = %d", run_only_suite, run_only_test);

	if ((run_only_suite >= 0) && (run_only_test >= 0)) {
		printf("Specify either -s or -t!\n");
		return PCUT_OUTCOME_BAD_INVOCATION;
	}

	if (run_only_suite > 0) {
		pcut_item_t *suite = pcut_find_by_id(items, run_only_suite);
		if (suite == NULL) {
			printf("Suite not found, aborting!\n");
			return PCUT_OUTCOME_BAD_INVOCATION;
		}
		if (suite->kind != PCUT_KIND_TESTSUITE) {
			printf("Invalid suite id!\n");
			return PCUT_OUTCOME_BAD_INVOCATION;
		}

		run_suite(suite, NULL, argv[0]);
		return PCUT_OUTCOME_PASS;
	}

	if (run_only_test > 0) {
		pcut_item_t *test = pcut_find_by_id(items, run_only_test);
		if (test == NULL) {
			printf("Test not found, aborting!\n");
			return PCUT_OUTCOME_BAD_INVOCATION;
		}
		if (test->kind != PCUT_KIND_TEST) {
			printf("Invalid test id!\n");
			return PCUT_OUTCOME_BAD_INVOCATION;
		}

		if (pcut_run_mode == PCUT_RUN_MODE_SINGLE) {
			rc = pcut_run_test_single(test);
		} else {
			rc = pcut_run_test_forked(test);
		}

		return rc;
	}

	/* Otherwise, run the whole thing. */
	pcut_report_init(items);

	rc = PCUT_OUTCOME_PASS;

	it = items;
	while (it != NULL) {
		if (it->kind == PCUT_KIND_TESTSUITE) {
			pcut_item_t *tmp;
			rc_tmp = run_suite(it, &tmp, argv[0]);
			if (rc_tmp != PCUT_OUTCOME_PASS) {
				rc = rc_tmp;
			}
			it = tmp;
		} else {
			it = pcut_get_real_next(it);
		}
	}

	pcut_report_done();

	return rc;
}